

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-math.cc
# Opt level: O2

void math_sin_pi_test(void)

{
  int i;
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = -360.0;
  for (uVar1 = 0xfffffe98; uVar1 != 0x169; uVar1 = uVar1 + 1) {
    dVar3 = sin((dVar2 * 3.141592653589793) / 180.0);
    dVar4 = tinyusdz::math::sin_pi_imp<double>(dVar2 / 180.0);
    if (1.1102230246251565e-15 < ABS(dVar3 - dVar4)) {
      dVar5 = fmax(ABS(dVar3),ABS(dVar4));
      if (dVar5 * 1.1102230246251565e-15 < ABS(dVar3 - dVar4)) {
        printf("sin(%d degree) differes: ref = %lf, sin_pi = %lf\n",dVar3,dVar4,(ulong)uVar1);
        acutest_check_(0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                       ,0x1e,"%s","0");
      }
    }
    dVar2 = dVar2 + 1.0;
  }
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x21,"%s","1");
  return;
}

Assistant:

void math_sin_pi_test(void) {

  double kPI = math::constants<double>::pi();

  for (int i = -360; i <= 360; i++) {
    double ref_v = std::sin(double(i) * kPI / 180.0);
    double sin_v = math::sin_pi(double(i)/180.0);
    // TODO: dyanmically change eps based on input degree value.
    if (!math::is_close(ref_v, sin_v, 5*std::numeric_limits<double>::epsilon())) {
      printf("sin(%d degree) differes: ref = %lf, sin_pi = %lf\n", i, ref_v, sin_v);
      TEST_CHECK(0);
    }
  }
  TEST_CHECK(1); // ok
}